

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::IsFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  bool bVar1;
  int iVar2;
  const_reference this;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_50 [32];
  undefined1 local_30 [8];
  ScriptIPtr s;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)params;
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)local_30);
  bVar1 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::empty
                    ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                     s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    Script::Error(peVar3,"\'is finished\' function invoked with no parameters");
    Jinx::Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    this = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                     ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                      s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,0);
    bVar1 = Jinx::Variant::IsCoroutine(this);
    if (bVar1) {
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                 s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,0);
      Jinx::Variant::GetCoroutine((Variant *)local_50);
      peVar4 = std::__shared_ptr_access<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      iVar2 = (**peVar4->_vptr_ICoroutine)();
      Jinx::Variant::Variant(__return_storage_ptr__,(bool)((byte)iVar2 & 1));
      std::shared_ptr<Jinx::ICoroutine>::~shared_ptr((shared_ptr<Jinx::ICoroutine> *)local_50);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      Script::Error(peVar3,"Invalid parameters to \'is finished\' function");
      Jinx::Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  local_50._16_4_ = 1;
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr((shared_ptr<Jinx::Impl::Script> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant IsFinished(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'is finished' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsCoroutine())
		{
			s->Error("Invalid parameters to 'is finished' function");
			return nullptr;
		}
		return params[0].GetCoroutine()->IsFinished();
	}